

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-filter-tokens.cc
# Opt level: O1

void __thiscall ColorToGray::handleToken(ColorToGray *this,Token *token)

{
  deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_> *this_00;
  deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_> *this_01;
  _Map_pointer ppTVar1;
  bool bVar2;
  reference pvVar3;
  long lVar4;
  ColorToGray *pCVar5;
  double dVar6;
  double dVar7;
  long *local_80 [2];
  long local_70 [2];
  double local_60;
  double local_58;
  string local_50;
  
  this_00 = &this->all_stack;
  if ((this->all_stack).
      super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur !=
      (this->all_stack).
      super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    do {
      pvVar3 = std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::at
                         (this_00,0);
      if (1 < pvVar3->type - tt_space) break;
      std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::at(this_00,0);
      QPDFObjectHandle::TokenFilter::writeToken((Token *)this);
      std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::pop_front(this_00);
    } while ((this->all_stack).
             super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur !=
             (this->all_stack).
             super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur);
  }
  std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::push_back(this_00,token);
  if (token->type - tt_space < 2) goto LAB_0010391e;
  this_01 = &this->stack;
  std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::push_back(this_01,token);
  ppTVar1 = (this->stack).
            super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  lVar4 = ((long)(this->stack).
                 super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_last -
           (long)(this->stack).
                 super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * 0x4ec4ec4ec4ec4ec5 +
          ((long)(this->stack).
                 super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_cur -
           (long)(this->stack).
                 super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * 0x4ec4ec4ec4ec4ec5 +
          (((long)ppTVar1 -
            (long)(this->stack).
                  super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
          (ulong)(ppTVar1 == (_Map_pointer)0x0)) * 4;
  if (lVar4 == 4) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"rg","");
    bVar2 = QPDFTokenizer::Token::isWord(token,&local_50);
    if (!bVar2) goto LAB_001037dc;
    pvVar3 = std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::at(this_01,0);
    if ((pvVar3->type != tt_real) && (pvVar3->type != tt_integer)) goto LAB_001037dc;
    pvVar3 = std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::at(this_01,1);
    if ((pvVar3->type != tt_real) && (pvVar3->type != tt_integer)) goto LAB_001037dc;
    pvVar3 = std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::at(this_01,2);
    bVar2 = (pvVar3->type - tt_integer & 0xfffffffd) == 0;
  }
  else {
LAB_001037dc:
    bVar2 = false;
  }
  if ((lVar4 == 4) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2)) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    pCVar5 = (ColorToGray *)this_01;
    pvVar3 = std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::at(this_01,0);
    local_58 = numericValue(pCVar5,pvVar3);
    pCVar5 = (ColorToGray *)this_01;
    pvVar3 = std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::at(this_01,1);
    local_60 = numericValue(pCVar5,pvVar3);
    pCVar5 = (ColorToGray *)this_01;
    pvVar3 = std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::at(this_01,2);
    dVar6 = numericValue(pCVar5,pvVar3);
    dVar7 = local_60 * 0.11 + local_58 * 0.3 + dVar6 * 0.59;
    dVar6 = 1.0;
    if (dVar7 <= 1.0) {
      dVar6 = dVar7;
    }
    dVar7 = 0.0;
    if (0.0 <= dVar6) {
      dVar7 = dVar6;
    }
    QUtil::double_to_string_abi_cxx11_(dVar7,(int)local_80,true);
    QPDFObjectHandle::TokenFilter::write((string *)this);
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    local_80[0] = local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_80," g","");
    QPDFObjectHandle::TokenFilter::write((string *)this);
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::clear(this_01);
    std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::clear(this_00);
  }
LAB_0010391e:
  ppTVar1 = (this->stack).
            super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  if (((long)(this->stack).
             super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>._M_impl.
             super__Deque_impl_data._M_start._M_last -
       (long)(this->stack).
             super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur >> 3) * 0x4ec4ec4ec4ec4ec5 +
      ((long)(this->stack).
             super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur -
       (long)(this->stack).
             super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>._M_impl.
             super__Deque_impl_data._M_finish._M_first >> 3) * 0x4ec4ec4ec4ec4ec5 +
      (((long)ppTVar1 -
        (long)(this->stack).
              super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>._M_impl
              .super__Deque_impl_data._M_start._M_node >> 3) + -1 +
      (ulong)(ppTVar1 == (_Map_pointer)0x0)) * 4 == 4) {
    std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::at(this_00,0);
    QPDFObjectHandle::TokenFilter::writeToken((Token *)this);
    std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::pop_front(this_00);
    std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::pop_front(&this->stack)
    ;
  }
  return;
}

Assistant:

void
ColorToGray::handleToken(QPDFTokenizer::Token const& token)
{
    // Track the number of non-ignorable tokens we've seen. If we see an "rg" following three
    // numbers, convert it to a grayscale value. Keep writing tokens to the output as we can.

    // There are several things to notice here. We keep two stacks: one of "meaningful" tokens, and
    // one of all tokens. This way we can preserve whitespace or comments that we encounter in the
    // stream and there preserve layout. As we receive tokens, we keep the last four meaningful
    // tokens. If we see three numbers followed by rg, we use the three numbers to calculate a gray
    // value that is perceptually similar to the color value and then write the "g" operator to the
    // output, discarding any spaces or comments encountered embedded in the "rg" operator.

    // The stack and all_stack members are updated in such a way that they always contain exactly
    // the same non-ignorable tokens. The stack member contains the tokens that would be left if you
    // removed all space and comment tokens from all_stack.

    // On each new token, flush out any space or comment tokens. Store the incoming token. If we
    // just got an rg preceded by the right kinds of operands, replace the command. Flush any
    // additional accumulated tokens to keep the stack only four tokens deep.

    while ((!this->all_stack.empty()) && isIgnorable(this->all_stack.at(0).getType())) {
        writeToken(this->all_stack.at(0));
        this->all_stack.pop_front();
    }
    this->all_stack.push_back(token);
    QPDFTokenizer::token_type_e token_type = token.getType();
    if (!isIgnorable(token_type)) {
        this->stack.push_back(token);
        if ((this->stack.size() == 4) && token.isWord("rg") &&
            (isNumeric(this->stack.at(0).getType())) && (isNumeric(this->stack.at(1).getType())) &&
            (isNumeric(this->stack.at(2).getType()))) {
            double r = numericValue(this->stack.at(0));
            double g = numericValue(this->stack.at(1));
            double b = numericValue(this->stack.at(2));
            double gray = ((0.3 * r) + (0.59 * b) + (0.11 * g));
            if (gray > 1.0) {
                gray = 1.0;
            }
            if (gray < 0.0) {
                gray = 0.0;
            }
            write(QUtil::double_to_string(gray, 3));
            write(" g");
            this->stack.clear();
            this->all_stack.clear();
        }
    }
    if (this->stack.size() == 4) {
        writeToken(this->all_stack.at(0));
        this->all_stack.pop_front();
        this->stack.pop_front();
    }
}